

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus
readSolutionFile(string *filename,HighsOptions *options,HighsLp *lp,HighsBasis *basis,
                HighsSolution *solution,HighsInt style)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  HighsStatus HVar5;
  iterator iVar6;
  ulong uVar7;
  char *format;
  size_type __new_size;
  long lVar8;
  HighsLogOptions *log_options_;
  HighsInt num_col;
  HighsInt num_row;
  HighsInt iCol;
  double value;
  string keyword;
  HighsSolution read_solution;
  string name;
  string section_name;
  HighsBasis read_basis;
  ifstream in_file;
  uint local_388;
  uint local_384;
  value_type_conflict1 local_380;
  double local_378;
  size_type local_370;
  HighsSolution *local_368;
  string local_360;
  HighsSolution local_340;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  char local_278 [16];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_268;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_250;
  undefined1 local_238 [520];
  
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  if ((style & 0xfffffffbU) != 0) {
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot read file of style %d\n",
                 (ulong)(uint)style);
    return kError;
  }
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0) {
    HVar5 = kError;
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot open readable file \"%s\"\n",
                 (filename->_M_dataplus)._M_p);
    goto LAB_00242bd3;
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  uVar1 = lp->num_col_;
  __new_size = (size_type)(int)uVar1;
  iVar4 = lp->num_row_;
  local_340.value_valid = solution->value_valid;
  local_340.dual_valid = solution->dual_valid;
  std::vector<double,_std::allocator<double>_>::vector(&local_340.col_value,&solution->col_value);
  std::vector<double,_std::allocator<double>_>::vector(&local_340.col_dual,&solution->col_dual);
  std::vector<double,_std::allocator<double>_>::vector(&local_340.row_value,&solution->row_value);
  std::vector<double,_std::allocator<double>_>::vector(&local_340.row_dual,&solution->row_dual);
  local_298._8_4_ = basis->debug_update_count;
  local_298[0] = basis->valid;
  local_298[1] = basis->alien;
  local_298[2] = basis->useful;
  local_298[3] = basis->was_alien;
  local_298._4_4_ = basis->debug_id;
  local_288._M_p = local_278;
  pcVar2 = (basis->debug_origin_name)._M_dataplus._M_p;
  local_368 = solution;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + (basis->debug_origin_name)._M_string_length);
  local_370 = (long)iVar4;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_268,&basis->col_status);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_250,&basis->row_status);
  HighsSolution::clear(&local_340);
  HighsBasis::clear((HighsBasis *)local_298);
  std::vector<double,_std::allocator<double>_>::resize(&local_340.col_value,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&local_340.row_value,local_370);
  std::vector<double,_std::allocator<double>_>::resize(&local_340.col_dual,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&local_340.row_dual,local_370);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(&local_268,__new_size);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(&local_250,local_370);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  bVar3 = readSolutionFileIdIgnoreLineOk(&local_2b8,(ifstream *)local_238);
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
    if (iVar4 == 0) {
      if ((lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        HVar5 = kError;
        highsLogUser(log_options_,kError,
                     "readSolutionFile: Cannot read a MIPLIB solution file without column names in the model\n"
                    );
      }
      else {
        if ((lp->col_hash_).name2index._M_h._M_element_count == 0) {
          HighsNameHash::form(&lp->col_hash_,&lp->col_names_);
        }
        local_380 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&local_340.col_value,__new_size,&local_380);
        do {
          bVar3 = readSolutionFileIdDoubleLineOk(&local_2d8,&local_378,(ifstream *)local_238);
          if (!bVar3) break;
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&lp->col_hash_,&local_2d8);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            format = "readSolutionFile: name %s is not found\n";
LAB_00242bfb:
            HVar5 = kError;
            highsLogUser(log_options_,kError,format,local_2d8._M_dataplus._M_p);
            goto LAB_00242b0b;
          }
          if ((long)*(int *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                   ._M_cur + 0x28) == -1) {
            format = "readSolutionFile: name %s is duplicated\n";
            goto LAB_00242bfb;
          }
          local_340.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start
          [*(int *)((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28)] = local_378;
        } while (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) ==
                 0);
LAB_002429d3:
        local_340.value_valid = true;
        bVar3 = readSolutionFileHashKeywordIntLineOk
                          (&local_360,(HighsInt *)&local_384,(ifstream *)local_238);
        uVar1 = local_384;
        if (bVar3) {
          uVar7 = (ulong)local_384;
          if (0 < (int)local_384) {
            lVar8 = 0;
            do {
              bVar3 = readSolutionFileIdDoubleLineOk(&local_2d8,&local_378,(ifstream *)local_238);
              if (!bVar3) {
                HVar5 = kError;
                std::ifstream::close();
                goto LAB_00242b0b;
              }
              if (uVar1 == (uint)local_370) {
                local_340.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8] = local_378;
              }
              lVar8 = lVar8 + 1;
              uVar7 = (ulong)(int)local_384;
            } while (lVar8 < (long)uVar7);
          }
          if (uVar1 == (uint)local_370) {
LAB_00242c1c:
            if (((((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2)
                  == 0) &&
                (std::istream::ignore((long)local_238,0x50),
                ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) ==
                0)) && (std::istream::ignore((long)local_238,0x50),
                       ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] &
                       2) == 0)) {
              std::istream::ignore((long)local_238,0x50);
              if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2)
                  != 0) goto LAB_00242a9a;
              std::operator>>((istream *)local_238,(string *)&local_360);
              iVar4 = std::__cxx11::string::compare((char *)&local_360);
              if (iVar4 != 0) {
                if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2)
                    != 0) goto LAB_00242a9a;
                std::istream::ignore((long)local_238,0x50);
                bVar3 = readSolutionFileHashKeywordIntLineOk
                                  (&local_360,(HighsInt *)&local_388,(ifstream *)local_238);
                if (!bVar3) goto LAB_00242ed6;
                if (0 < (int)local_388) {
                  lVar8 = 0;
                  do {
                    bVar3 = readSolutionFileIdDoubleLineOk
                                      (&local_2d8,&local_380,(ifstream *)local_238);
                    if (!bVar3) {
                      HVar5 = kError;
                      std::ifstream::close();
                      goto LAB_00242b0b;
                    }
                    local_340.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8] = local_380;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < (int)local_388);
                }
                bVar3 = readSolutionFileHashKeywordIntLineOk
                                  (&local_360,(HighsInt *)&local_384,(ifstream *)local_238);
                if (!bVar3) {
                  HVar5 = kOk;
                  readSolutionFileReturn
                            (kOk,local_368,basis,&local_340,(HighsBasis *)local_298,
                             (ifstream *)local_238);
                  goto LAB_00242b0b;
                }
                if (0 < (int)local_384) {
                  lVar8 = 0;
                  do {
                    bVar3 = readSolutionFileIdDoubleLineOk
                                      (&local_2d8,&local_380,(ifstream *)local_238);
                    if (!bVar3) {
                      HVar5 = kError;
                      std::ifstream::close();
                      goto LAB_00242b0b;
                    }
                    local_340.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8] = local_380;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < (int)local_384);
                }
              }
              if (((((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2)
                    == 0) &&
                  (std::istream::ignore((long)local_238,0x50),
                  ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2)
                  == 0)) &&
                 (std::istream::ignore((long)local_238,0x50),
                 ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) ==
                 0)) {
                std::istream::ignore((long)local_238,0x50);
                HVar5 = readBasisStream(log_options_,(HighsBasis *)local_298,(ifstream *)local_238);
                readSolutionFileReturn
                          (HVar5,local_368,basis,&local_340,(HighsBasis *)local_298,
                           (ifstream *)local_238);
                goto LAB_00242b0b;
              }
            }
LAB_00242ed6:
            HVar5 = kOk;
            readSolutionFileReturn
                      (kOk,local_368,basis,&local_340,(HighsBasis *)local_298,(ifstream *)local_238)
            ;
          }
          else {
            highsLogUser(log_options_,kWarning,
                         "readSolutionFile: Solution file is for %d rows, not %d: row values ignored\n"
                         ,uVar7);
            HVar5 = calculateRowValuesQuad(lp,&local_340.col_value,&local_340.row_value,-1);
            if (HVar5 == kOk) goto LAB_00242c1c;
LAB_00242a9a:
            HVar5 = kError;
            std::ifstream::close();
          }
        }
        else {
          HVar5 = calculateRowValuesQuad(lp,&local_340.col_value,&local_340.row_value,-1);
LAB_00242af1:
          if (HVar5 != kOk) goto LAB_00242af9;
          HVar5 = kOk;
          readSolutionFileReturn
                    (kOk,local_368,basis,&local_340,(HighsBasis *)local_298,(ifstream *)local_238);
        }
      }
    }
    else {
      if ((((((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) == 0)
           && (std::istream::ignore((long)local_238,0x50),
              ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) == 0)
           ) && (std::istream::ignore((long)local_238,0x50),
                ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) ==
                0)) &&
         (std::istream::ignore((long)local_238,0x50),
         ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) == 0)) {
        std::operator>>((istream *)local_238,(string *)&local_360);
        iVar4 = std::__cxx11::string::compare((char *)&local_360);
        if (iVar4 == 0) {
          HVar5 = kWarning;
          std::ifstream::close();
          goto LAB_00242b0b;
        }
        if ((((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) == 0)
           && (std::istream::ignore((long)local_238,0x50),
              ((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 2) == 0)
           ) {
          std::istream::ignore((long)local_238,0x50);
          bVar3 = readSolutionFileHashKeywordIntLineOk
                            (&local_360,(HighsInt *)&local_388,(ifstream *)local_238);
          if (bVar3) {
            if ((int)local_388 < 1) {
              local_388 = -local_388;
              local_380 = 0.0;
              std::vector<double,_std::allocator<double>_>::_M_fill_assign
                        (&local_340.col_value,__new_size,&local_380);
              if (0 < (int)local_388) {
                iVar4 = 0;
                do {
                  bVar3 = readSolutionFileIdDoubleIntLineOk
                                    (&local_378,(HighsInt *)&local_380,(ifstream *)local_238);
                  if (!bVar3) {
                    std::ifstream::close();
                    HVar5 = kError;
                    goto LAB_00242b0b;
                  }
                  local_340.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_380._0_4_] = local_378;
                  iVar4 = iVar4 + 1;
                } while (iVar4 < (int)local_388);
              }
              local_340.value_valid = true;
              HVar5 = calculateRowValuesQuad(lp,&local_340.col_value,&local_340.row_value,-1);
              goto LAB_00242af1;
            }
            if (local_388 == uVar1) {
              lVar8 = 0;
              do {
                bVar3 = readSolutionFileIdDoubleLineOk(&local_2d8,&local_378,(ifstream *)local_238);
                if (!bVar3) {
                  HVar5 = kError;
                  std::ifstream::close();
                  goto LAB_00242b0b;
                }
                local_340.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8] = local_378;
                lVar8 = lVar8 + 1;
              } while (lVar8 < (int)local_388);
              goto LAB_002429d3;
            }
            highsLogUser(log_options_,kError,
                         "readSolutionFile: Solution file is for %d columns, not %d\n",
                         (ulong)local_388,(ulong)uVar1);
          }
        }
      }
LAB_00242af9:
      HVar5 = kError;
      std::ifstream::close();
    }
  }
  else {
    HVar5 = kError;
    std::ifstream::close();
  }
LAB_00242b0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_250.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if (local_340.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_340.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_340.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_340.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
LAB_00242bd3:
  std::ifstream::~ifstream(local_238);
  return HVar5;
}

Assistant:

HighsStatus readSolutionFile(const std::string filename,
                             const HighsOptions& options, HighsLp& lp,
                             HighsBasis& basis, HighsSolution& solution,
                             const HighsInt style) {
  const HighsLogOptions& log_options = options.log_options;
  if (style != kSolutionStyleRaw && style != kSolutionStyleSparse) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot read file of style %d\n",
                 (int)style);
    return HighsStatus::kError;
  }
  std::ifstream in_file(filename);
  if (in_file.fail()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return HighsStatus::kError;
  }
  std::string keyword;
  std::string name;
  double value;
  HighsInt num_col;
  HighsInt num_row;
  const HighsInt lp_num_col = lp.num_col_;
  const HighsInt lp_num_row = lp.num_row_;
  // Define identifiers for reading in
  HighsSolution read_solution = solution;
  HighsBasis read_basis = basis;
  read_solution.clear();
  read_basis.clear();
  read_solution.col_value.resize(lp_num_col);
  read_solution.row_value.resize(lp_num_row);
  read_solution.col_dual.resize(lp_num_col);
  read_solution.row_dual.resize(lp_num_row);
  read_basis.col_status.resize(lp_num_col);
  read_basis.row_status.resize(lp_num_row);
  std::string section_name;
  if (!readSolutionFileIdIgnoreLineOk(section_name, in_file))
    return readSolutionFileErrorReturn(
        in_file);  // Model (status) or =obj= (value)
  const bool miplib_sol = section_name == "=obj=";
  if (miplib_sol) {
    // A MIPLIB solution file has nonzero solution values for a subset
    // of the variables identified by name, so there must be column
    // names
    if (!lp.col_names_.size()) {
      highsLogUser(log_options, HighsLogType::kError,
                   "readSolutionFile: Cannot read a MIPLIB solution file "
                   "without column names in the model\n");
      return HighsStatus::kError;
    }
    // Ensure that the col name hash table has been formed
    if (!lp.col_hash_.name2index.size()) lp.col_hash_.form(lp.col_names_);
  }
  bool sparse = false;
  if (!miplib_sol) {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Optimal
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  //
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // # Primal solution values
    if (!readSolutionFileKeywordLineOk(keyword, in_file))
      return readSolutionFileErrorReturn(in_file);
    // Read in the primal solution values: return warning if there is none
    if (keyword == "None")
      return readSolutionFileReturn(HighsStatus::kWarning, solution, basis,
                                    read_solution, read_basis, in_file);
    // If there are primal solution values then keyword is the status
    // and the next line is objective
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Objective
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileErrorReturn(in_file);
    assert(keyword == "Columns");
    // The default style parameter is kSolutionStyleRaw, and this still
    // allows sparse files to be read. Recognise the latter from num_col
    // <= 0. Doesn't matter if num_col = 0, since there's nothing to
    // read either way
    sparse = num_col <= 0;
    if (style == kSolutionStyleSparse) assert(sparse);
    if (sparse) {
      num_col = -num_col;
      assert(num_col <= lp_num_col);
    } else {
      if (num_col != lp_num_col) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                     " columns, not %" HIGHSINT_FORMAT "\n",
                     num_col, lp_num_col);
        return readSolutionFileErrorReturn(in_file);
      }
    }
  }
  if (miplib_sol) {
    HighsInt num_value = 0;
    read_solution.col_value.assign(lp_num_col, 0);
    for (;;) {
      // Only false return is for encountering EOF
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file)) break;
      auto search = lp.col_hash_.name2index.find(name);
      if (search == lp.col_hash_.name2index.end()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is not found\n", name.c_str());
        return HighsStatus::kError;
      } else if (search->second == kHashIsDuplicate) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is duplicated\n", name.c_str());
        return HighsStatus::kError;
      }
      HighsInt iCol = search->second;
      assert(lp.col_names_[iCol] == name);
      read_solution.col_value[iCol] = value;
      num_value++;
      if (in_file.eof()) break;
    }
  } else if (sparse) {
    read_solution.col_value.assign(lp_num_col, 0);
    HighsInt iCol;
    for (HighsInt iX = 0; iX < num_col; iX++) {
      if (!readSolutionFileIdDoubleIntLineOk(value, iCol, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  } else {
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  }
  read_solution.value_valid = true;
  if (sparse) {
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  // Read in the col values: OK to have none, otherwise next line
  // should be "Rows" and correct number
  if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file)) {
    // Compute the row values since there are none to read
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  assert(keyword == "Rows");
  // OK to read from a file with different number of rows, since the
  // primal solution is all that's important. For example, see #1284,
  // where the user is solving a sequence of MIPs with the same number
  // of variables, but increasing numbers of constraints, and wants to
  // used the solution from one MIP as the starting solution for the
  // next.
  const bool num_row_ok = num_row == lp_num_row;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
      return readSolutionFileErrorReturn(in_file);
    if (num_row_ok) read_solution.row_value[iRow] = value;
  }
  if (!num_row_ok) {
    highsLogUser(log_options, HighsLogType::kWarning,
                 "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                 " rows, not %" HIGHSINT_FORMAT ": row values ignored\n",
                 num_row, lp_num_row);
    // Calculate the row values
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to dual solution values
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Dual solution values
  // If there's a reference to dual solution values, there's a keyword
  // to indicate their status
  if (!readSolutionFileKeywordLineOk(keyword, in_file))
    return readSolutionFileErrorReturn(in_file);
  if (keyword != "None") {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Columns");
    double dual;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_dual[iCol] = dual;
    }
    // Read in the col values: next line should be "Rows" and correct
    // number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Rows");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.row_dual[iRow] = dual;
    }
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to basis
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Basis
  HighsStatus basis_read_status =
      readBasisStream(log_options, read_basis, in_file);
  // Return with basis read status
  return readSolutionFileReturn(basis_read_status, solution, basis,
                                read_solution, read_basis, in_file);
}